

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O3

void __thiscall Lib::Deque<Kernel::Clause_*>::expand(Deque<Kernel::Clause_*> *this)

{
  size_t sVar1;
  Clause **ppCVar2;
  Clause **ppCVar3;
  size_t sVar4;
  long lVar5;
  Clause **ppCVar6;
  long lVar7;
  ulong uVar8;
  
  sVar1 = this->_capacity;
  ppCVar6 = this->_front;
  sVar4 = 0;
  if (this->_back < ppCVar6) {
    sVar4 = sVar1;
  }
  ppCVar3 = this->_back + sVar4;
  uVar8 = sVar1 * 0x10;
  if (uVar8 == 0) {
    ppCVar2 = (Clause **)
              FixedSizeAllocator<8UL>::alloc
                        ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar8 < 0x11) {
    ppCVar2 = (Clause **)
              FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar8 < 0x19) {
    ppCVar2 = (Clause **)
              FixedSizeAllocator<24UL>::alloc
                        ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar8 < 0x21) {
    ppCVar2 = (Clause **)
              FixedSizeAllocator<32UL>::alloc
                        ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar8 < 0x31) {
    ppCVar2 = (Clause **)
              FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar8 < 0x41) {
    ppCVar2 = (Clause **)
              FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppCVar2 = (Clause **)::operator_new(uVar8,0x10);
  }
  lVar7 = (long)ppCVar3 - (long)ppCVar6 >> 3;
  if (ppCVar3 == ppCVar6) {
    ppCVar6 = this->_data;
  }
  else {
    ppCVar3 = this->_front;
    lVar5 = 0;
    do {
      ppCVar2[lVar5] = *ppCVar3;
      ppCVar3 = ppCVar3 + 1;
      ppCVar6 = this->_data;
      if (ppCVar3 == this->_end) {
        ppCVar3 = ppCVar6;
      }
      lVar5 = lVar5 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar5);
  }
  if (ppCVar6 != (Clause **)0x0) {
    uVar8 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar8 == 0) {
      *ppCVar6 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppCVar6;
    }
    else if (uVar8 < 0x11) {
      *ppCVar6 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppCVar6;
    }
    else if (uVar8 < 0x19) {
      *ppCVar6 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppCVar6;
    }
    else if (uVar8 < 0x21) {
      *ppCVar6 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppCVar6;
    }
    else if (uVar8 < 0x31) {
      *ppCVar6 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppCVar6;
    }
    else if (uVar8 < 0x41) {
      *ppCVar6 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppCVar6;
    }
    else {
      operator_delete(ppCVar6,0x10);
    }
  }
  this->_data = ppCVar2;
  this->_front = ppCVar2;
  this->_back = ppCVar2 + lVar7;
  this->_end = ppCVar2 + sVar1 * 2;
  this->_capacity = sVar1 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }